

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O3

void __thiscall
google::protobuf::io::Printer::PrintImpl
          (Printer *this,string_view format,
          Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          args,PrintOptions opts)

{
  pointer ppVar1;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long> *ppVar2;
  lts_20250127 *plVar3;
  pointer pcVar4;
  AnnotationCollector *pAVar5;
  pointer pfVar6;
  pointer pCVar7;
  _anonymous_namespace_ *p_Var8;
  iterator __position;
  pointer pfVar9;
  undefined4 uVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined1 uVar14;
  pointer ppVar15;
  bool bVar16;
  bool bVar17;
  char cVar18;
  int iVar19;
  pointer pCVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  pointer prVar22;
  LogMessage *this_00;
  byte bVar23;
  char *pcVar24;
  lts_20250127 *extraout_RDX;
  lts_20250127 *extraout_RDX_00;
  lts_20250127 *extraout_RDX_01;
  lts_20250127 *extraout_RDX_04;
  lts_20250127 *extraout_RDX_05;
  lts_20250127 *extraout_RDX_06;
  lts_20250127 *extraout_RDX_07;
  lts_20250127 *extraout_RDX_08;
  lts_20250127 *extraout_RDX_10;
  lts_20250127 *extraout_RDX_11;
  lts_20250127 *plVar25;
  int *__s2;
  lts_20250127 *extraout_RDX_13;
  lts_20250127 *extraout_RDX_15;
  undefined8 extraout_RDX_16;
  undefined8 extraout_RDX_17;
  undefined8 extraout_RDX_18;
  undefined8 extraout_RDX_19;
  undefined8 extraout_RDX_20;
  int *extraout_RDX_21;
  undefined8 uVar26;
  lts_20250127 *extraout_RDX_23;
  lts_20250127 *extraout_RDX_24;
  lts_20250127 *extraout_RDX_25;
  lts_20250127 *extraout_RDX_26;
  size_t sVar27;
  undefined8 extraout_RDX_28;
  lts_20250127 *extraout_RDX_30;
  lts_20250127 *extraout_RDX_31;
  lts_20250127 *extraout_RDX_32;
  lts_20250127 *extraout_RDX_33;
  size_t sVar28;
  lts_20250127 *extraout_RDX_34;
  lts_20250127 *extraout_RDX_35;
  lts_20250127 *extraout_RDX_36;
  lts_20250127 *extraout_RDX_37;
  lts_20250127 *extraout_RDX_38;
  lts_20250127 *extraout_RDX_39;
  bool bVar29;
  lts_20250127 *plVar30;
  ulong uVar31;
  _anonymous_namespace_ *this_01;
  ulong index;
  lts_20250127 *plVar32;
  long lVar33;
  char *pcVar34;
  char *pcVar35;
  size_type sVar36;
  undefined8 in_R9;
  lts_20250127 *plVar37;
  size_type __rlen;
  string_view sVar38;
  Span<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  frames;
  string_view var;
  string_view str;
  string_view str_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message_02;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message_03;
  Span<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  frames_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message_04;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message_05;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message_06;
  Span<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  frames_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message_07;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message_08;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message_09;
  PrintOptions opts_00;
  PrintOptions opts_01;
  PrintOptions opts_02;
  PrintOptions opts_03;
  PrintOptions opts_04;
  PrintOptions opts_05;
  PrintOptions opts_06;
  PrintOptions opts_07;
  PrintOptions opts_08;
  PrintOptions opts_09;
  PrintOptions opts_10;
  PrintOptions opts_11;
  PrintOptions opts_12;
  optional<google::protobuf::io::Printer::ValueImpl<false>_> sub;
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
  annot_records;
  vector<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  annot_stack;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>::iterator,_bool>
  insertion;
  Format fmt;
  optional<google::protobuf::io::Printer::AnnotationRecord> same_name_record;
  string_view local_250;
  ulong local_240;
  pointer local_238;
  ulong local_230;
  size_t local_228;
  ulong local_220;
  undefined1 local_218 [16];
  string local_208 [8];
  undefined8 local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_1f8 [3];
  bool local_1c8;
  void *local_1b8;
  iterator iStack_1b0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long> *local_1a8;
  vector<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_198;
  size_t local_180;
  lts_20250127 *local_178;
  pointer local_170;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_168;
  lts_20250127 *local_160;
  undefined1 local_158 [80];
  bool local_108;
  Format local_f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_d8;
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  *local_d0;
  size_t local_c8;
  char *local_c0;
  ulong local_b8;
  Options *local_b0;
  AnyInvocable<void_(std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation)>
  *local_a8;
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  *local_a0;
  _Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_&,_false> local_98;
  size_t *local_90;
  size_t local_88;
  size_t local_80;
  _Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> local_78;
  lts_20250127 *extraout_RDX_02;
  lts_20250127 *extraout_RDX_03;
  lts_20250127 *extraout_RDX_09;
  lts_20250127 *extraout_RDX_12;
  lts_20250127 *extraout_RDX_14;
  lts_20250127 *extraout_RDX_22;
  lts_20250127 *extraout_RDX_27;
  lts_20250127 *extraout_RDX_29;
  undefined8 extraout_RDX_40;
  
  local_230 = args.len_;
  local_170 = args.ptr_;
  local_180 = this->indent_;
  local_168 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              &this->line_start_variables_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_168,
                    (this->line_start_variables_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  if (opts.use_substitution_map == true) {
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
    ::clear((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
             *)&this->substitutions_);
  }
  TokenizeFormat(&local_f8,this,format,&opts);
  PrintCodegenTrace(this,(_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                         opts.loc.
                         super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>
                   );
  local_198.
  super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.
  super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.
  super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_240 = 0;
  local_1a8 = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long> *)0x0;
  local_1b8 = (void *)0x0;
  iStack_1b0._M_current =
       (pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long> *)0x0;
  plVar25 = extraout_RDX;
  sVar27 = format._M_len;
  pcVar34 = format._M_str;
  if (local_f8.lines.
      super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_f8.lines.
      super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_a8 = &this->substitution_listener_;
    local_d8 = &this->paren_depth_to_omit_;
    local_d0 = &this->substitutions_;
    local_b0 = &this->options_;
    local_240 = 0;
    local_220 = 0;
    uVar31 = 0;
    local_c8 = format._M_len;
    local_c0 = format._M_str;
    do {
      local_238 = local_f8.lines.
                  super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar31;
      if (((uVar31 != 0) && ((local_220 & 1) == 0)) &&
         ((local_f8.is_raw_string != true ||
          ((local_238[-1].chunks.
            super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_238[-1].chunks.
            super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
            ._M_impl.super__Vector_impl_data._M_finish || ((this->at_start_of_line_ & 1U) == 0))))))
      {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_168,
                          (this->line_start_variables_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        zc_sink_internal::ZeroCopyStreamByteSink::Append(&this->sink_,"\n",1);
        this->at_start_of_line_ = true;
        plVar25 = extraout_RDX_00;
      }
      this->indent_ = local_238->indent + local_180;
      pCVar20 = (local_238->chunks).
                super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_b8 = uVar31;
      if ((local_238->chunks).
          super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
          ._M_impl.super__Vector_impl_data._M_finish == pCVar20) {
        local_220 = 0;
      }
      else {
        local_220 = 0;
        plVar32 = (lts_20250127 *)0x0;
        do {
          plVar3 = (lts_20250127 *)pCVar20[(long)plVar32].text._M_len;
          pcVar34 = pCVar20[(long)plVar32].text._M_str;
          if ((pCVar20[(long)plVar32].is_var & 1U) == 0) {
            WriteRaw(this,pcVar34,(size_t)plVar3);
            plVar25 = extraout_RDX_07;
          }
          else if (plVar3 == (lts_20250127 *)0x0) {
            WriteRaw(this,&local_b0->variable_delimiter,1);
            plVar25 = extraout_RDX_08;
          }
          else {
            local_250._M_str = pcVar34;
            local_250._M_len = (size_t)plVar3;
            plVar30 = plVar3;
            if ((this->substitution_listener_).
                super_Impl<void_(std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation)>
                .
                super_CoreImpl<false,_void,_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation>
                .invoker_ !=
                (InvokerType<false,_void,_std::basic_string_view<char>,_google::protobuf::io::Printer::SourceLocation>
                 *)0x0) {
              absl::lts_20250127::internal_any_invocable::
              Impl<void_(std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation)>
              ::operator()(&local_a8->
                            super_Impl<void_(std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation)>
                           ,plVar3,pcVar34);
              plVar25 = extraout_RDX_01;
              plVar30 = (lts_20250127 *)local_250._M_len;
            }
            ppVar15 = local_198.
                      super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            ppVar1 = local_198.
                     super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            bVar12 = opts.strip_raw_string_indentation;
            bVar11 = opts.strip_spaces_around_vars;
            bVar16 = opts.allow_digit_substitutions;
            uVar10 = opts._0_4_;
            if ((opts.use_curly_brace_substitutions == true) && (plVar30 != (lts_20250127 *)0x0)) {
              opts_00.use_annotation_frames = SUB81(plVar25,0);
              if (*local_250._M_str == '{') {
                plVar30 = plVar30 + -1;
                local_250._M_str = local_250._M_str + 1;
                local_250._M_len = (size_t)plVar30;
                opts_11.use_curly_brace_substitutions = true;
                opts_11.loc.
                super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                _M_payload.
                super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                     opts.loc.
                     super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
                opts_11.checks_are_debug_only = opts.checks_are_debug_only;
                opts_11.use_substitution_map = opts.use_substitution_map;
                opts_11.allow_digit_substitutions = opts.allow_digit_substitutions;
                opts_11.strip_spaces_around_vars = opts.strip_spaces_around_vars;
                opts_11.strip_raw_string_indentation = opts.strip_raw_string_indentation;
                local_218._0_8_ = (_anonymous_namespace_ *)0x1e;
                local_218._8_8_ = "expected single-digit variable";
                message.invoker_ =
                     absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::io::Printer::Validate(bool,google::protobuf::io::Printer::PrintOptions,std::basic_string_view<char,std::char_traits<char>>)::__0,std::__cxx11::string>
                ;
                message.ptr_.obj = local_218;
                opts_00.loc.
                super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                _M_payload.
                super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                     (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                     (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                     opts.loc.
                     super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
                opts_00.checks_are_debug_only = (bool)opts.checks_are_debug_only;
                opts_00.use_substitution_map = (bool)opts.use_substitution_map;
                opts_00.use_curly_brace_substitutions = true;
                opts_00.allow_digit_substitutions = opts.allow_digit_substitutions;
                opts_00.strip_spaces_around_vars = opts.strip_spaces_around_vars;
                opts_00.strip_raw_string_indentation = opts.strip_raw_string_indentation;
                Validate(plVar30 == (lts_20250127 *)0x1,opts_00,message);
                plVar25 = extraout_RDX_02;
                if (plVar30 == (lts_20250127 *)0x1) {
                  cVar18 = *local_250._M_str;
                  local_218._0_8_ = (_anonymous_namespace_ *)0x16;
                  local_218._8_8_ = "expected digit after {";
                  message_00.invoker_ =
                       absl::lts_20250127::functional_internal::
                       InvokeObject<google::protobuf::io::Printer::Validate(bool,google::protobuf::io::Printer::PrintOptions,std::basic_string_view<char,std::char_traits<char>>)::__0,std::__cxx11::string>
                  ;
                  message_00.ptr_.obj = local_218;
                  opts_01.use_annotation_frames = SUB81(extraout_RDX_02,0);
                  opts_01.loc.
                  super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                  _M_payload.
                  super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                       (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                       (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                       (short)uVar10;
                  opts_01.checks_are_debug_only = (bool)SUB41(uVar10,2);
                  opts_01.use_substitution_map = (bool)SUB41(uVar10,3);
                  opts_01.use_curly_brace_substitutions = true;
                  opts_01.allow_digit_substitutions = bVar16;
                  opts_01.strip_spaces_around_vars = bVar11;
                  opts_01.strip_raw_string_indentation = bVar12;
                  Validate((byte)(cVar18 - 0x30U) < 10,opts_01,message_00);
                  plVar25 = extraout_RDX_03;
                  if ((byte)(cVar18 - 0x30U) < 10) {
                    uVar31 = (long)*local_250._M_str - 0x31;
                    opts_11.use_annotation_frames = SUB81(in_R9,0);
                    in_R9 = in_R9 & 0xff;
                    bVar16 = ValidateIndexLookupInBounds(this,uVar31,local_240,local_230,opts_11);
                    plVar25 = extraout_RDX_04;
                    if (!bVar16) goto LAB_0022af51;
                    bVar16 = uVar31 == local_240;
                    IndentIfAtStart(this);
                    if (uVar31 < local_230) {
                      local_218._0_8_ = (this->sink_).bytes_written_;
                      local_218._8_8_ = (char *)0x0;
                      local_208 = (string  [8])aaStack_1f8;
                      pcVar4 = local_170[uVar31]._M_dataplus._M_p;
                      std::__cxx11::string::_M_construct<char*>
                                (local_208,pcVar4,pcVar4 + local_170[uVar31]._M_string_length);
                      std::
                      vector<std::pair<std::pair<unsigned_long,unsigned_long>,std::__cxx11::string>,std::allocator<std::pair<std::pair<unsigned_long,unsigned_long>,std::__cxx11::string>>>
                      ::
                      emplace_back<std::pair<std::pair<unsigned_long,unsigned_long>,std::__cxx11::string>>
                                ((vector<std::pair<std::pair<unsigned_long,unsigned_long>,std::__cxx11::string>,std::allocator<std::pair<std::pair<unsigned_long,unsigned_long>,std::__cxx11::string>>>
                                  *)&local_198,
                                 (pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_218);
                      plVar25 = extraout_RDX_05;
                      if (local_208 != (string  [8])aaStack_1f8) {
                        operator_delete((void *)local_208,
                                        (ulong)(aaStack_1f8[0]._M_allocated_capacity + 1));
                        plVar25 = extraout_RDX_06;
                      }
                      local_240 = local_240 + bVar16;
                      goto LAB_0022af51;
                    }
                    PrintImpl();
LAB_0022b8af:
                    PrintImpl();
LAB_0022b8b4:
                    std::__throw_out_of_range_fmt
                              ("%s: __pos (which is %zu) > __size (which is %zu)",
                               "basic_string_view::substr");
                  }
                }
              }
              else {
                if (*local_250._M_str != '}') goto LAB_0022ad56;
                local_250._M_str = local_250._M_str + 1;
                local_250._M_len = (size_t)(plVar30 + -1);
                opts_02.use_curly_brace_substitutions = true;
                opts_02.loc.
                super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                _M_payload.
                super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                     opts.loc.
                     super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
                opts_02.checks_are_debug_only = opts.checks_are_debug_only;
                opts_02.use_substitution_map = opts.use_substitution_map;
                opts_02.allow_digit_substitutions = opts.allow_digit_substitutions;
                opts_02.strip_spaces_around_vars = opts.strip_spaces_around_vars;
                opts_02.strip_raw_string_indentation = opts.strip_raw_string_indentation;
                local_218._0_8_ = (_anonymous_namespace_ *)0x1c;
                local_218._8_8_ = "unexpected end of annotation";
                message_01.invoker_ =
                     absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::io::Printer::Validate(bool,google::protobuf::io::Printer::PrintOptions,std::basic_string_view<char,std::char_traits<char>>)::__0,std::__cxx11::string>
                ;
                message_01.ptr_.obj = local_218;
                opts_02.use_annotation_frames = opts_00.use_annotation_frames;
                Validate(local_198.
                         super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start !=
                         local_198.
                         super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,opts_02,message_01);
                plVar25 = extraout_RDX_09;
                if (ppVar1 != ppVar15) {
                  local_198.
                  super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].first.second =
                       (this->sink_).bytes_written_;
                  pAVar5 = (this->options_).annotation_collector;
                  if (pAVar5 != (AnnotationCollector *)0x0) {
                    (**(code **)(*(long *)pAVar5 + 0x20))
                              (pAVar5,local_198.
                                      super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + -1);
                    plVar25 = extraout_RDX_10;
                  }
                  ppVar1 = local_198.
                           super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -1;
                  pcVar4 = local_198.
                           super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-1].second._M_dataplus._M_p;
                  paVar21 = &local_198.
                             super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish[-1].second.field_2;
                  local_198.
                  super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = ppVar1;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pcVar4 != paVar21) {
                    operator_delete(pcVar4,paVar21->_M_allocated_capacity + 1);
                    plVar25 = extraout_RDX_11;
                  }
                }
              }
            }
            else {
LAB_0022ad56:
              if (opts.strip_spaces_around_vars == true) {
                sVar38._M_str = (char *)plVar25;
                sVar38._M_len = (size_t)local_250._M_str;
                sVar38 = absl::lts_20250127::StripLeadingAsciiWhitespace(plVar30,sVar38);
                local_250._M_str = sVar38._M_str;
                plVar25 = (lts_20250127 *)sVar38._M_len;
                plVar37 = plVar3 + -(long)plVar25;
                if (plVar3 < plVar3 + -(long)plVar25) {
                  plVar37 = plVar3;
                }
                pcVar24 = local_250._M_str + (long)plVar25;
                pcVar35 = pcVar24;
                if (0 < (long)plVar25 >> 2) {
                  pcVar35 = local_250._M_str + ((uint)sVar38._M_len & 3);
                  lVar33 = ((long)plVar25 >> 2) + 1;
                  do {
                    if (((&absl::lts_20250127::ascii_internal::kPropertyBits)[(byte)pcVar24[-1]] & 8
                        ) == 0) goto LAB_0022aea0;
                    if (((&absl::lts_20250127::ascii_internal::kPropertyBits)[(byte)pcVar24[-2]] & 8
                        ) == 0) {
                      pcVar24 = pcVar24 + -1;
                      goto LAB_0022aea0;
                    }
                    if (((&absl::lts_20250127::ascii_internal::kPropertyBits)[(byte)pcVar24[-3]] & 8
                        ) == 0) {
                      pcVar24 = pcVar24 + -2;
                      goto LAB_0022aea0;
                    }
                    if (((&absl::lts_20250127::ascii_internal::kPropertyBits)[(byte)pcVar24[-4]] & 8
                        ) == 0) {
                      pcVar24 = pcVar24 + -3;
                      goto LAB_0022aea0;
                    }
                    pcVar24 = pcVar24 + -4;
                    lVar33 = lVar33 + -1;
                  } while (1 < lVar33);
                }
                lVar33 = (long)pcVar35 - (long)local_250._M_str;
                if (lVar33 == 1) {
LAB_0022ae7f:
                  pcVar24 = pcVar35;
                  if (((&absl::lts_20250127::ascii_internal::kPropertyBits)[(byte)pcVar35[-1]] & 8)
                      != 0) {
                    pcVar24 = local_250._M_str;
                  }
                }
                else if (lVar33 == 2) {
LAB_0022ae71:
                  pcVar24 = pcVar35;
                  if (((&absl::lts_20250127::ascii_internal::kPropertyBits)[(byte)pcVar35[-1]] & 8)
                      != 0) {
                    pcVar35 = pcVar35 + -1;
                    goto LAB_0022ae7f;
                  }
                }
                else {
                  pcVar24 = local_250._M_str;
                  if ((lVar33 == 3) &&
                     (pcVar24 = pcVar35,
                     ((&absl::lts_20250127::ascii_internal::kPropertyBits)[(byte)pcVar35[-1]] & 8)
                     != 0)) {
                    pcVar35 = pcVar35 + -1;
                    goto LAB_0022ae71;
                  }
                }
LAB_0022aea0:
                plVar30 = (lts_20250127 *)(pcVar24 + -(long)local_250._M_str);
                if (plVar25 < (lts_20250127 *)(pcVar24 + -(long)local_250._M_str)) {
                  plVar30 = plVar25;
                }
                local_250._M_len = (size_t)plVar30;
                plVar25 = plVar30 + (long)plVar37;
                uVar31 = (long)plVar3 - (long)plVar25;
                if (plVar3 < plVar25) goto LAB_0022b8b4;
                plVar25 = plVar25 + (long)pcVar34;
                local_178 = plVar37;
                local_160 = plVar25;
              }
              else {
                local_160 = (lts_20250127 *)0x0;
                uVar31 = 0;
                pcVar34 = (char *)0x0;
                local_178 = (lts_20250127 *)0x0;
              }
              bVar29 = opts.use_annotation_frames;
              bVar13 = opts.strip_raw_string_indentation;
              bVar12 = opts.strip_spaces_around_vars;
              bVar11 = opts.allow_digit_substitutions;
              bVar16 = opts.use_curly_brace_substitutions;
              uVar10 = opts._0_4_;
              in_R9 = &opts;
              opts_08.use_curly_brace_substitutions = opts.use_curly_brace_substitutions;
              opts_08.loc.
              super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
              _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>
                   = opts.loc.
                     super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
              opts_08.checks_are_debug_only = opts.checks_are_debug_only;
              opts_08.use_substitution_map = opts.use_substitution_map;
              opts_08.allow_digit_substitutions = opts.allow_digit_substitutions;
              opts_08.strip_spaces_around_vars = opts.strip_spaces_around_vars;
              opts_08.strip_raw_string_indentation = opts.strip_raw_string_indentation;
              local_218._0_8_ = (_anonymous_namespace_ *)0x19;
              local_218._8_8_ = "unexpected empty variable";
              message_02.invoker_ =
                   absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::io::Printer::Validate(bool,google::protobuf::io::Printer::PrintOptions,std::basic_string_view<char,std::char_traits<char>>)::__0,std::__cxx11::string>
              ;
              message_02.ptr_.obj = local_218;
              opts_03.use_annotation_frames = SUB81(plVar25,0);
              opts_03.loc.
              super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
              _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>
                   = (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                     (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                     opts.loc.
                     super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
              opts_03.checks_are_debug_only = (bool)opts.checks_are_debug_only;
              opts_03.use_substitution_map = (bool)opts.use_substitution_map;
              opts_03.use_curly_brace_substitutions = opts.use_curly_brace_substitutions;
              opts_03.allow_digit_substitutions = opts.allow_digit_substitutions;
              opts_03.strip_spaces_around_vars = opts.strip_spaces_around_vars;
              opts_03.strip_raw_string_indentation = opts.strip_raw_string_indentation;
              Validate(plVar30 != (lts_20250127 *)0x0,opts_03,message_02);
              plVar25 = extraout_RDX_12;
              if (plVar30 == (lts_20250127 *)0x0) goto LAB_0022af51;
              bVar17 = local_250._M_len >= (_anonymous_namespace_ *)0x7;
              __s2 = (int *)local_250._M_str;
              this_01 = (_anonymous_namespace_ *)local_250._M_len;
              if (local_250._M_len < (_anonymous_namespace_ *)0x7) {
LAB_0022af8b:
                if ((_anonymous_namespace_ *)0x4 < this_01) goto LAB_0022af91;
LAB_0022afa5:
                bVar23 = 0;
              }
              else {
                if (*(int *)((long)local_250._M_str + 3) == 0x24747261 &&
                    *(int *)local_250._M_str == 0x6174735f) {
                  __s2 = (int *)((long)local_250._M_str + 7);
                  this_01 = (_anonymous_namespace_ *)(local_250._M_len + -7);
                  local_250._M_str = (char *)__s2;
                  local_250._M_len = (size_t)this_01;
                  goto LAB_0022af8b;
                }
                bVar17 = false;
LAB_0022af91:
                if ((char)__s2[1] != '$' || *__s2 != 0x646e655f) goto LAB_0022afa5;
                __s2 = (int *)((long)__s2 + 5);
                this_01 = this_01 + -5;
                local_250._M_str = (char *)__s2;
                local_250._M_len = (size_t)this_01;
                bVar23 = 1;
              }
              if (((bVar23 | bVar17) & bVar29) == 1) {
                if (bVar17 == false) {
                  pCVar20 = (local_238->chunks).
                            super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  pCVar7 = (local_238->chunks).
                           super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  ppVar2 = iStack_1b0._M_current + -1;
                  p_Var8 = (_anonymous_namespace_ *)iStack_1b0._M_current[-1].first._M_len;
                  pcVar34 = iStack_1b0._M_current[-1].first._M_str;
                  paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)iStack_1b0._M_current[-1].second;
                  iStack_1b0._M_current = ppVar2;
                  if ((p_Var8 == this_01) &&
                     ((this_01 == (_anonymous_namespace_ *)0x0 ||
                      (iVar19 = bcmp(pcVar34,__s2,(size_t)this_01), __s2 = extraout_RDX_21,
                      iVar19 == 0)))) {
                    bVar29 = true;
                  }
                  else {
                    bVar29 = false;
                  }
                  local_200 = local_250._M_len;
                  aaStack_1f8[0]._M_allocated_capacity = local_250._M_str;
                  message_06.invoker_ =
                       absl::lts_20250127::functional_internal::
                       InvokeObject<google::protobuf::io::Printer::PrintImpl(std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::Span<std::__cxx11::string_const>,google::protobuf::io::Printer::PrintOptions)::__1,std::__cxx11::string>
                  ;
                  message_06.ptr_.obj = local_218;
                  opts_07.use_annotation_frames = SUB81(__s2,0);
                  opts_07.loc.
                  super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                  _M_payload.
                  super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                       (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                       (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                       (short)uVar10;
                  opts_07.checks_are_debug_only = (bool)SUB41(uVar10,2);
                  opts_07.use_substitution_map = (bool)SUB41(uVar10,3);
                  opts_07.use_curly_brace_substitutions = bVar16;
                  opts_07.allow_digit_substitutions = bVar11;
                  opts_07.strip_spaces_around_vars = bVar12;
                  opts_07.strip_raw_string_indentation = bVar13;
                  local_218._0_8_ = p_Var8;
                  local_218._8_8_ = pcVar34;
                  local_208 = (string  [8])paVar21;
                  Validate(bVar29,opts_07,message_06);
                  local_220 = CONCAT71((int7)(local_220 >> 8),
                                       (byte)local_220 | (long)pCVar20 - (long)pCVar7 == 0x18);
                  plVar25 = extraout_RDX_27;
                  if (bVar29 != false) {
                    pfVar9 = (this->annotation_lookups_).
                             super__Vector_base<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    frames_01.len_ =
                         (long)(this->annotation_lookups_).
                               super__Vector_base<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar9 >> 5;
                    frames_01.ptr_ = pfVar9;
                    anon_unknown_4::
                    LookupInFrameStack<google::protobuf::io::Printer::AnnotationRecord>
                              ((optional<google::protobuf::io::Printer::AnnotationRecord> *)
                               local_218,local_250,frames_01);
                    uVar14 = aaStack_1f8[2]._0_1_;
                    local_158._0_8_ = local_250._M_len;
                    local_158._8_8_ = local_250._M_str;
                    message_07.invoker_ =
                         absl::lts_20250127::functional_internal::
                         InvokeObject<google::protobuf::io::Printer::PrintImpl(std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::Span<std::__cxx11::string_const>,google::protobuf::io::Printer::PrintOptions)::__2,std::__cxx11::string>
                    ;
                    message_07.ptr_.obj = local_158;
                    opts_08.use_annotation_frames = SUB81(extraout_RDX_28,0);
                    Validate((bool)aaStack_1f8[2]._0_1_,opts_08,message_07);
                    plVar25 = extraout_RDX_29;
                    if (((bool)uVar14 != false) &&
                       (pAVar5 = (this->options_).annotation_collector,
                       pAVar5 != (AnnotationCollector *)0x0)) {
                      in_R9 = aaStack_1f8[1]._8_8_;
                      (**(code **)(*(long *)pAVar5 + 0x18))
                                (pAVar5,paVar21,(this->sink_).bytes_written_,&local_200,local_218);
                      plVar25 = extraout_RDX_30;
                    }
                    if (aaStack_1f8[2]._0_1_ == '\x01') {
                      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::
                      _M_destroy((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                                  *)local_218);
                      plVar25 = extraout_RDX_31;
                    }
                  }
                }
                else {
                  IndentIfAtStart(this);
                  local_208 = (string  [8])(this->sink_).bytes_written_;
                  local_218._0_8_ = local_250._M_len;
                  local_218._8_8_ = local_250._M_str;
                  if (iStack_1b0._M_current == local_1a8) {
                    std::
                    vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>>>
                    ::
                    _M_realloc_insert<std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>>
                              ((vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>>>
                                *)&local_1b8,iStack_1b0,
                               (pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
                                *)local_218);
                    plVar25 = extraout_RDX_26;
                  }
                  else {
                    (iStack_1b0._M_current)->second = (unsigned_long)local_208;
                    ((iStack_1b0._M_current)->first)._M_len = local_250._M_len;
                    ((iStack_1b0._M_current)->first)._M_str = local_250._M_str;
                    iStack_1b0._M_current = iStack_1b0._M_current + 1;
                    plVar25 = extraout_RDX_13;
                  }
                  plVar32 = plVar32 + 1;
                  pCVar20 = (local_238->chunks).
                            super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if (plVar32 < (lts_20250127 *)
                                (((long)(local_238->chunks).
                                        super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar20
                                 >> 3) * -0x5555555555555555)) {
                    sVar27 = pCVar20[(long)plVar32].text._M_len;
                    pcVar34 = pCVar20[(long)plVar32].text._M_str;
                    if (sVar27 == 0) {
                      sVar27 = 0;
                    }
                    else {
                      pcVar35 = pcVar34 + sVar27;
                      do {
                        if (*pcVar34 != ' ') goto LAB_0022b51e;
                        pcVar34 = pcVar34 + 1;
                        sVar27 = sVar27 - 1;
                      } while (sVar27 != 0);
                      sVar27 = 0;
                      pcVar34 = pcVar35;
                    }
LAB_0022b51e:
                    WriteRaw(this,pcVar34,sVar27);
                    plVar25 = extraout_RDX_32;
                  }
                }
              }
              else {
                local_1c8 = false;
                local_78._M_engaged = false;
                if (((bVar11 & 1U) == 0) || (9 < (byte)((char)*__s2 - 0x30U))) {
                  pfVar6 = (this->var_lookups_).
                           super__Vector_base<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  frames.ptr_ = (pointer)((long)(this->var_lookups_).
                                                super__Vector_base<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)pfVar6 >> 5);
                  frames.len_._0_4_ = SUB84(in_R9,0);
                  frames.len_._4_1_ = SUB81(in_R9,4);
                  frames.len_._5_3_ = SUB83(in_R9,5);
                  var._M_str = (char *)pfVar6;
                  var._M_len = (size_t)__s2;
                  (anonymous_namespace)::
                  LookupInFrameStack<google::protobuf::io::Printer::ValueImpl<false>>
                            ((optional<google::protobuf::io::Printer::ValueImpl<false>_> *)local_158
                             ,this_01,var,frames);
                  std::_Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>::
                  _M_move_assign((_Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>
                                  *)local_218,
                                 (_Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>
                                  *)local_158);
                  uVar26 = extraout_RDX_17;
                  if (local_108 == true) {
                    std::_Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>::
                    _M_destroy((_Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>
                                *)local_158);
                    uVar26 = extraout_RDX_18;
                  }
                  if ((bVar29 & 1U) != 0) {
                    pfVar9 = (this->annotation_lookups_).
                             super__Vector_base<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    frames_00.len_ =
                         (long)(this->annotation_lookups_).
                               super__Vector_base<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar9 >> 5;
                    frames_00.ptr_ = pfVar9;
                    anon_unknown_4::
                    LookupInFrameStack<google::protobuf::io::Printer::AnnotationRecord>
                              ((optional<google::protobuf::io::Printer::AnnotationRecord> *)
                               local_158,local_250,frames_00);
                    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::
                    _M_move_assign(&local_78,
                                   (_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                                    *)local_158);
                    uVar26 = extraout_RDX_19;
                    if (local_158[0x40] == '\x01') {
                      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::
                      _M_destroy((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                                  *)local_158);
                      uVar26 = extraout_RDX_20;
                    }
                  }
LAB_0022b224:
                  bVar16 = local_1c8;
                  uVar10 = opts._0_4_;
                  opts_06.use_curly_brace_substitutions = opts.use_curly_brace_substitutions;
                  opts_06.loc.
                  super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                  _M_payload.
                  super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                       opts.loc.
                       super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                       ._M_payload.
                       super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
                  opts_06.checks_are_debug_only = opts.checks_are_debug_only;
                  opts_06.use_substitution_map = opts.use_substitution_map;
                  opts_06.allow_digit_substitutions = opts.allow_digit_substitutions;
                  opts_06.strip_spaces_around_vars = opts.strip_spaces_around_vars;
                  opts_06.strip_raw_string_indentation = opts.strip_raw_string_indentation;
                  local_158._0_8_ = local_250._M_len;
                  local_158._8_8_ = local_250._M_str;
                  message_04.invoker_ =
                       absl::lts_20250127::functional_internal::
                       InvokeObject<google::protobuf::io::Printer::PrintImpl(std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::Span<std::__cxx11::string_const>,google::protobuf::io::Printer::PrintOptions)::__3,std::__cxx11::string>
                  ;
                  message_04.ptr_.obj = local_158;
                  opts_05.use_annotation_frames = SUB81(uVar26,0);
                  opts_05.loc.
                  super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                  _M_payload.
                  super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                       (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                       (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                       opts.loc.
                       super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                       ._M_payload.
                       super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
                  opts_05.checks_are_debug_only = (bool)opts.checks_are_debug_only;
                  opts_05.use_substitution_map = (bool)opts.use_substitution_map;
                  opts_05.use_curly_brace_substitutions = opts.use_curly_brace_substitutions;
                  opts_05.allow_digit_substitutions = opts.allow_digit_substitutions;
                  opts_05.strip_spaces_around_vars = opts.strip_spaces_around_vars;
                  opts_05.strip_raw_string_indentation = opts.strip_raw_string_indentation;
                  Validate(local_1c8,opts_05,message_04);
                  plVar25 = extraout_RDX_22;
                  if (bVar16 != false) {
                    if (aaStack_1f8[0]._M_local_buf[0] == '\0') {
                      sVar27 = (this->sink_).bytes_written_;
                      if (this->at_start_of_line_ == true) {
                        if ((_anonymous_namespace_ *)local_218._0_8_ == (_anonymous_namespace_ *)0x0
                           ) {
                          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                          emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                                    (local_168,&local_250);
                          plVar25 = extraout_RDX_23;
                          goto LAB_0022b28f;
                        }
LAB_0022b2a0:
                        WriteRaw(this,pcVar34,(size_t)local_178);
                        WriteRaw(this,(char *)local_218._8_8_,local_218._0_8_);
                        sVar28 = (this->sink_).bytes_written_;
                        sVar27 = sVar28 - local_218._0_8_;
                        WriteRaw(this,(char *)local_160,uVar31);
                        plVar25 = extraout_RDX_24;
                        goto LAB_0022b354;
                      }
LAB_0022b28f:
                      local_228 = sVar27;
                      if ((_anonymous_namespace_ *)local_218._0_8_ != (_anonymous_namespace_ *)0x0)
                      goto LAB_0022b2a0;
LAB_0022b362:
                      sVar27 = local_228;
                      if ((bool)aaStack_1f8[2]._8_1_ == true) {
                        local_158._0_8_ = this->paren_depth_ + 1;
                        __position._M_current =
                             (this->paren_depth_to_omit_).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
                        if (__position._M_current ==
                            (this->paren_depth_to_omit_).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) {
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                          _M_realloc_insert<unsigned_long>
                                    (local_d8,__position,(unsigned_long *)local_158);
                          plVar25 = extraout_RDX_33;
                        }
                        else {
                          *__position._M_current = local_158._0_8_;
                          (this->paren_depth_to_omit_).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish = __position._M_current + 1;
                        }
                      }
                    }
                    else {
                      if (aaStack_1f8[0]._M_local_buf[0] != '\x01') {
                        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                                  ((LogMessageFatal *)local_158,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.cc"
                                   ,0x2ea,"fnc != nullptr");
LAB_0022b978:
                        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                                  ((LogMessageFatal *)local_158);
                      }
                      local_178 = (lts_20250127 *)((ulong)local_178 | uVar31);
                      local_158._0_8_ = 0x40;
                      local_158._8_8_ =
                           "substitution that resolves to callback cannot contain whitespace";
                      message_05.invoker_ =
                           absl::lts_20250127::functional_internal::
                           InvokeObject<google::protobuf::io::Printer::Validate(bool,google::protobuf::io::Printer::PrintOptions,std::basic_string_view<char,std::char_traits<char>>)::__0,std::__cxx11::string>
                      ;
                      message_05.ptr_.obj = local_158;
                      opts_06.use_annotation_frames = SUB81(extraout_RDX_22,0);
                      Validate(local_178 == (lts_20250127 *)0x0,opts_06,message_05);
                      if (local_208 == (string  [8])0x0) {
                        std::__throw_bad_function_call();
                      }
                      sVar27 = (this->sink_).bytes_written_;
                      cVar18 = (*(code *)local_200)();
                      if (cVar18 == '\0') {
                        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                                  ((LogMessageFatal *)local_158,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.cc"
                                   ,0x2f1,"(*fnc)()");
                        str._M_str = "recursive call encountered while evaluating \"";
                        str._M_len = 0x2d;
                        absl::lts_20250127::log_internal::LogMessage::
                        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                                  ((LogMessage *)local_158,str);
                        this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<
                                            ((LogMessage *)local_158,local_250);
                        str_00._M_str = "\"";
                        str_00._M_len = 1;
                        absl::lts_20250127::log_internal::LogMessage::
                        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                                  (this_00,str_00);
                        goto LAB_0022b978;
                      }
                      sVar28 = (this->sink_).bytes_written_;
                      plVar25 = extraout_RDX_25;
LAB_0022b354:
                      local_228 = sVar28;
                      if (sVar27 == sVar28) goto LAB_0022b362;
                    }
                    if (aaStack_1f8[1]._0_8_ != 0) {
                      plVar3 = plVar32 + 1;
                      pCVar20 = (local_238->chunks).
                                super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      plVar25 = (lts_20250127 *)
                                (((long)(local_238->chunks).
                                        super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar20
                                 >> 3) * -0x5555555555555555);
                      if ((plVar3 < plVar25) &&
                         (plVar25 = (lts_20250127 *)((long)plVar3 * 3),
                         pCVar20[(long)plVar3].is_var == false)) {
                        sVar28 = pCVar20[(long)plVar3].text._M_len;
                        pcVar34 = pCVar20[(long)plVar3].text._M_str;
                        sVar36 = 0;
                        do {
                          if ((sVar28 != 0) &&
                             (*pcVar34 == *(char *)(aaStack_1f8[0]._8_8_ + sVar36))) {
                            pcVar34 = pcVar34 + 1;
                            sVar28 = sVar28 - 1;
                            break;
                          }
                          sVar36 = sVar36 + 1;
                        } while (aaStack_1f8[1]._0_8_ != sVar36);
                        WriteRaw(this,pcVar34,sVar28);
                        plVar25 = extraout_RDX_34;
                        plVar32 = plVar3;
                      }
                    }
                    if ((local_78._M_engaged == true) &&
                       (pAVar5 = (this->options_).annotation_collector,
                       pAVar5 != (AnnotationCollector *)0x0)) {
                      in_R9 = local_78._M_payload._M_value.semantic.
                              super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>
                      ;
                      (**(code **)(*(long *)pAVar5 + 0x18))
                                (pAVar5,sVar27,local_228,
                                 (undefined1 *)((long)&local_78._M_payload + 0x18),&local_78);
                      plVar25 = extraout_RDX_35;
                    }
                    if (((uint)uVar10 >> 0x18 & 1) != 0) {
                      local_80 = local_228;
                      local_a0 = local_d0;
                      local_98._M_head_impl = &local_250;
                      local_90 = &local_88;
                      in_R9 = &local_90;
                      local_88 = sVar27;
                      absl::lts_20250127::container_internal::
                      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
                      ::EmplaceDecomposable::operator()
                                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>::iterator,_bool>
                                  *)local_158,&local_a0,local_98._M_head_impl,
                                 (piecewise_construct_t *)&std::piecewise_construct,
                                 (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&> *)
                                 &local_98,
                                 (tuple<std::pair<unsigned_long,_unsigned_long>_&&> *)in_R9);
                      plVar25 = extraout_RDX_38;
                      if (local_158[0x10] == '\0') {
                        prVar22 = absl::lts_20250127::container_internal::
                                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                                  ::iterator::operator->((iterator *)local_158);
                        (prVar22->second).first = 1;
                        (prVar22->second).second = 0;
                        plVar25 = extraout_RDX_39;
                      }
                    }
                  }
                }
                else {
                  local_158._0_8_ = 0x1e;
                  local_158._8_8_ = "expected single-digit variable";
                  message_03.invoker_ =
                       absl::lts_20250127::functional_internal::
                       InvokeObject<google::protobuf::io::Printer::Validate(bool,google::protobuf::io::Printer::PrintOptions,std::basic_string_view<char,std::char_traits<char>>)::__0,std::__cxx11::string>
                  ;
                  message_03.ptr_.obj = local_158;
                  opts_04.use_annotation_frames = SUB81(__s2,0);
                  opts_04.loc.
                  super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                  _M_payload.
                  super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                       (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                       (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                       (short)uVar10;
                  opts_04.checks_are_debug_only = (bool)SUB41(uVar10,2);
                  opts_04.use_substitution_map = (bool)SUB41(uVar10,3);
                  opts_04.use_curly_brace_substitutions = bVar16;
                  opts_04.allow_digit_substitutions = bVar11;
                  opts_04.strip_spaces_around_vars = bVar12;
                  opts_04.strip_raw_string_indentation = bVar13;
                  Validate(this_01 == (_anonymous_namespace_ *)0x1,opts_04,message_03);
                  plVar25 = extraout_RDX_14;
                  if (this_01 == (_anonymous_namespace_ *)0x1) {
                    index = (long)*local_250._M_str - 0x31;
                    opts_12.use_annotation_frames = SUB81(in_R9,0);
                    opts_12.loc.
                    super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                    _M_payload.
                    super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                         (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                         (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                         (short)uVar10;
                    opts_12.checks_are_debug_only = (bool)SUB41(uVar10,2);
                    opts_12.use_substitution_map = (bool)SUB41(uVar10,3);
                    opts_12.use_curly_brace_substitutions = bVar16;
                    opts_12.allow_digit_substitutions = bVar11;
                    opts_12.strip_spaces_around_vars = bVar12;
                    opts_12.strip_raw_string_indentation = bVar13;
                    in_R9 = in_R9 & 0xff;
                    bVar16 = ValidateIndexLookupInBounds(this,index,local_240,local_230,opts_12);
                    plVar25 = extraout_RDX_15;
                    if (bVar16) {
                      if (local_230 <= index) goto LAB_0022b8af;
                      bVar16 = index == local_240;
                      std::optional<google::protobuf::io::Printer::ValueImpl<false>>::operator=
                                ((optional<google::protobuf::io::Printer::ValueImpl<false>> *)
                                 local_218,local_170 + index);
                      local_240 = local_240 + bVar16;
                      uVar26 = extraout_RDX_16;
                      goto LAB_0022b224;
                    }
                  }
                }
                if (local_78._M_engaged == true) {
                  std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::
                  _M_destroy(&local_78);
                  plVar25 = extraout_RDX_36;
                }
                if (local_1c8 == true) {
                  std::_Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>::
                  _M_destroy((_Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>
                              *)local_218);
                  plVar25 = extraout_RDX_37;
                }
              }
            }
          }
LAB_0022af51:
          plVar32 = plVar32 + 1;
          pCVar20 = (local_238->chunks).
                    super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (plVar32 < (lts_20250127 *)
                           (((long)(local_238->chunks).
                                   super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar20 >> 3)
                           * -0x5555555555555555));
      }
      uVar31 = local_b8 + 1;
      sVar27 = local_c8;
      pcVar34 = local_c0;
    } while (uVar31 < (ulong)((long)local_f8.lines.
                                    super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_f8.lines.
                                    super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  opts_10.use_curly_brace_substitutions = opts.use_curly_brace_substitutions;
  opts_10.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
  _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
       opts.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
       _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
  opts_10.checks_are_debug_only = opts.checks_are_debug_only;
  opts_10.use_substitution_map = opts.use_substitution_map;
  opts_10.allow_digit_substitutions = opts.allow_digit_substitutions;
  opts_10.strip_spaces_around_vars = opts.strip_spaces_around_vars;
  opts_10.strip_raw_string_indentation = opts.strip_raw_string_indentation;
  message_08.invoker_ =
       absl::lts_20250127::functional_internal::
       InvokeObject<google::protobuf::io::Printer::PrintImpl(std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::Span<std::__cxx11::string_const>,google::protobuf::io::Printer::PrintOptions)::__4,std::__cxx11::string>
  ;
  message_08.ptr_.obj = local_218;
  opts_09.use_annotation_frames = SUB81(plVar25,0);
  opts_09.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
  _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
       (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
       (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
       opts.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
       _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
  opts_09.checks_are_debug_only = (bool)opts.checks_are_debug_only;
  opts_09.use_substitution_map = (bool)opts.use_substitution_map;
  opts_09.use_curly_brace_substitutions = opts.use_curly_brace_substitutions;
  opts_09.allow_digit_substitutions = opts.allow_digit_substitutions;
  opts_09.strip_spaces_around_vars = opts.strip_spaces_around_vars;
  opts_09.strip_raw_string_indentation = opts.strip_raw_string_indentation;
  local_218._0_8_ = sVar27;
  local_218._8_8_ = pcVar34;
  Validate(local_240 == local_230,opts_09,message_08);
  message_09.invoker_ =
       absl::lts_20250127::functional_internal::
       InvokeObject<google::protobuf::io::Printer::PrintImpl(std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::Span<std::__cxx11::string_const>,google::protobuf::io::Printer::PrintOptions)::__5,std::__cxx11::string>
  ;
  message_09.ptr_.obj = local_218;
  opts_10.use_annotation_frames = SUB81(extraout_RDX_40,0);
  local_218._0_8_ = this;
  local_218._8_8_ = sVar27;
  local_208 = (string  [8])pcVar34;
  Validate(local_198.
           super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           local_198.
           super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish,opts_10,message_09);
  if ((local_f8.is_raw_string == true) && (this->at_start_of_line_ == false)) {
    WriteRaw(this,"\n",1);
    this->at_start_of_line_ = true;
  }
  if (local_1b8 != (void *)0x0) {
    operator_delete(local_1b8,(long)local_1a8 - (long)local_1b8);
  }
  std::
  vector<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_198);
  std::
  vector<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
  ::~vector(&local_f8.lines);
  this->indent_ = local_180;
  return;
}

Assistant:

void Printer::PrintImpl(absl::string_view format,
                        absl::Span<const std::string> args, PrintOptions opts) {
  // Inside of this function, we set indentation as we print new lines from
  // the format string. No matter how we exit this function, we should fix up
  // the indent to what it was before we entered; a cleanup makes it easy to
  // avoid this mistake.
  size_t original_indent = indent_;
  auto unindent =
      absl::MakeCleanup([this, original_indent] { indent_ = original_indent; });

  absl::string_view original = format;

  line_start_variables_.clear();

  if (opts.use_substitution_map) {
    substitutions_.clear();
  }

  auto fmt = TokenizeFormat(format, opts);
  PrintCodegenTrace(opts.loc);

  size_t arg_index = 0;
  bool skip_next_newline = false;
  std::vector<AnnotationCollector::Annotation> annot_stack;
  std::vector<std::pair<absl::string_view, size_t>> annot_records;
  for (size_t line_idx = 0; line_idx < fmt.lines.size(); ++line_idx) {
    const auto& line = fmt.lines[line_idx];

    // We only print a newline for lines that follow the first; a loop iteration
    // can also hint that we should not emit another newline through the
    // `skip_next_newline` variable.
    //
    // We also assume that double newlines are undesirable, so we
    // do not emit a newline if we are at the beginning of a line, *unless* the
    // previous format line is actually empty. This behavior is specific to
    // raw strings.
    if (line_idx > 0) {
      bool prev_was_empty = fmt.lines[line_idx - 1].chunks.empty();
      bool should_skip_newline =
          skip_next_newline ||
          (fmt.is_raw_string && (at_start_of_line_ && !prev_was_empty));
      if (!should_skip_newline) {
        line_start_variables_.clear();
        sink_.Write("\n");
        at_start_of_line_ = true;
      }
    }
    skip_next_newline = false;

    indent_ = original_indent + line.indent;

    for (size_t chunk_idx = 0; chunk_idx < line.chunks.size(); ++chunk_idx) {
      auto chunk = line.chunks[chunk_idx];

      if (!chunk.is_var) {
        PrintRaw(chunk.text);
        continue;
      }

      if (chunk.text.empty()) {
        // `$$` is an escape for just `$`.
        WriteRaw(&options_.variable_delimiter, 1);
        continue;
      }

      // If we get this far, we can conclude the chunk is a substitution
      // variable; we rename the `chunk` variable to make this clear below.
      absl::string_view var = chunk.text;
      if (substitution_listener_ != nullptr) {
        substitution_listener_(var, opts.loc.value_or(SourceLocation()));
      }
      if (opts.use_curly_brace_substitutions &&
          absl::ConsumePrefix(&var, "{")) {
        if (!Validate(var.size() == 1u, opts,
                      "expected single-digit variable")) {
          continue;
        }

        if (!Validate(absl::ascii_isdigit(var[0]), opts,
                      "expected digit after {")) {
          continue;
        }

        size_t idx = var[0] - '1';
        if (!ValidateIndexLookupInBounds(idx, arg_index, args.size(), opts)) {
          continue;
        }

        if (idx == arg_index) {
          ++arg_index;
        }

        IndentIfAtStart();
        annot_stack.push_back({{sink_.bytes_written(), 0}, args[idx]});
        continue;
      }

      if (opts.use_curly_brace_substitutions &&
          absl::ConsumePrefix(&var, "}")) {
        // The rest of var is actually ignored, and this is apparently
        // public API now. Oops?
        if (!Validate(!annot_stack.empty(), opts,
                      "unexpected end of annotation")) {
          continue;
        }

        annot_stack.back().first.second = sink_.bytes_written();
        if (options_.annotation_collector != nullptr) {
          options_.annotation_collector->AddAnnotationNew(annot_stack.back());
        }
        annot_stack.pop_back();
        continue;
      }

      absl::string_view prefix, suffix;
      if (opts.strip_spaces_around_vars) {
        var = absl::StripLeadingAsciiWhitespace(var);
        prefix = chunk.text.substr(0, chunk.text.size() - var.size());
        var = absl::StripTrailingAsciiWhitespace(var);
        suffix = chunk.text.substr(prefix.size() + var.size());
      }

      if (!Validate(!var.empty(), opts, "unexpected empty variable")) {
        continue;
      }

      bool is_start = absl::ConsumePrefix(&var, "_start$");
      bool is_end = absl::ConsumePrefix(&var, "_end$");
      if (opts.use_annotation_frames && (is_start || is_end)) {
        if (is_start) {
          IndentIfAtStart();
          annot_records.push_back({var, sink_.bytes_written()});

          // Skip all whitespace immediately after a _start.
          ++chunk_idx;
          if (chunk_idx < line.chunks.size()) {
            absl::string_view text = line.chunks[chunk_idx].text;
            while (absl::ConsumePrefix(&text, " ")) {
            }
            PrintRaw(text);
          }
        } else {
          // If a line consisted *only* of an _end, this will likely result in
          // a blank line if we do not zap the newline after it, so we do that
          // here.
          if (line.chunks.size() == 1) {
            skip_next_newline = true;
          }

          auto record_var = annot_records.back();
          annot_records.pop_back();

          if (!Validate(record_var.first == var, opts, [record_var, var] {
                return absl::StrFormat(
                    "_start and _end variables must match, but got %s and %s, "
                    "respectively",
                    record_var.first, var);
              })) {
            continue;
          }

          absl::optional<AnnotationRecord> record =
              LookupInFrameStack(var, absl::MakeSpan(annotation_lookups_));

          if (!Validate(record.has_value(), opts, [var] {
                return absl::StrCat("undefined annotation variable: \"",
                                    absl::CHexEscape(var), "\"");
              })) {
            continue;
          }

          if (options_.annotation_collector != nullptr) {
            options_.annotation_collector->AddAnnotation(
                record_var.second, sink_.bytes_written(), record->file_path,
                record->path, record->semantic);
          }
        }

        continue;
      }

      absl::optional<ValueView> sub;
      absl::optional<AnnotationRecord> same_name_record;
      if (opts.allow_digit_substitutions && absl::ascii_isdigit(var[0])) {
        if (!Validate(var.size() == 1u, opts,
                      "expected single-digit variable")) {
          continue;
        }

        size_t idx = var[0] - '1';
        if (!ValidateIndexLookupInBounds(idx, arg_index, args.size(), opts)) {
          continue;
        }
        if (idx == arg_index) {
          ++arg_index;
        }
        sub = args[idx];
      } else {
        sub = LookupInFrameStack(var, absl::MakeSpan(var_lookups_));

        if (opts.use_annotation_frames) {
          same_name_record =
              LookupInFrameStack(var, absl::MakeSpan(annotation_lookups_));
        }
      }

      // By returning here in case of empty we also skip possible spaces inside
      // the $...$, i.e. "void$ dllexpor$ f();" -> "void f();" in the empty
      // case.
      if (!Validate(sub.has_value(), opts, [var] {
            return absl::StrCat("undefined variable: \"", absl::CHexEscape(var),
                                "\"");
          })) {
        continue;
      }

      size_t range_start = sink_.bytes_written();
      size_t range_end = sink_.bytes_written();

      if (const absl::string_view* str = sub->AsString()) {
        if (at_start_of_line_ && str->empty()) {
          line_start_variables_.emplace_back(var);
        }

        if (!str->empty()) {
          // If `sub` is empty, we do not print the spaces around it.
          PrintRaw(prefix);
          PrintRaw(*str);
          range_end = sink_.bytes_written();
          range_start = range_end - str->size();
          PrintRaw(suffix);
        }
      } else {
        const ValueView::Callback* fnc = sub->AsCallback();
        ABSL_CHECK(fnc != nullptr);

        Validate(
            prefix.empty() && suffix.empty(), opts,
            "substitution that resolves to callback cannot contain whitespace");

        range_start = sink_.bytes_written();
        ABSL_CHECK((*fnc)())
            << "recursive call encountered while evaluating \"" << var << "\"";
        range_end = sink_.bytes_written();
      }

      if (range_start == range_end && sub->consume_parens_if_empty) {
        paren_depth_to_omit_.push_back(paren_depth_ + 1);
      }

      // If we just evaluated a value which specifies end-of-line consume-after
      // characters, and we're at the start of a line, that means we finished
      // with a newline.
      //
      // We trim a single end-of-line `consume_after` character in this case.
      //
      // This helps callback formatting "work as expected" with respect to forms
      // like
      //
      //   class Foo {
      //     $methods$;
      //   };
      //
      // Without this post-processing, it would turn into
      //
      //   class Foo {
      //     void Bar() {};
      //   };
      //
      // in many cases. Without the `;`, clang-format may format the template
      // incorrectly.
      auto next_idx = chunk_idx + 1;
      if (!sub->consume_after.empty() && next_idx < line.chunks.size() &&
          !line.chunks[next_idx].is_var) {
        chunk_idx = next_idx;

        absl::string_view text = line.chunks[chunk_idx].text;
        for (char c : sub->consume_after) {
          if (absl::ConsumePrefix(&text, absl::string_view(&c, 1))) {
            break;
          }
        }

        PrintRaw(text);
      }

      if (same_name_record.has_value() &&
          options_.annotation_collector != nullptr) {
        options_.annotation_collector->AddAnnotation(
            range_start, range_end, same_name_record->file_path,
            same_name_record->path, same_name_record->semantic);
      }

      if (opts.use_substitution_map) {
        auto insertion =
            substitutions_.emplace(var, std::make_pair(range_start, range_end));

        if (!insertion.second) {
          // This variable was used multiple times.
          // Make its span have negative length so
          // we can detect it if it gets used in an
          // annotation.
          insertion.first->second = {1, 0};
        }
      }
    }
  }

  Validate(arg_index == args.size(), opts,
           [original] { return absl::StrCat("unused args: ", original); });
  Validate(annot_stack.empty(), opts, [this, original] {
    return absl::StrFormat(
        "annotation range was not closed; expected %c}%c: %s",
        options_.variable_delimiter, options_.variable_delimiter, original);
  });

  // For multiline raw strings, we always make sure to end on a newline.
  if (fmt.is_raw_string && !at_start_of_line_) {
    PrintRaw("\n");
    at_start_of_line_ = true;
  }
}